

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecp.c
# Opt level: O0

int mbedtls_ecp_point_write_binary
              (mbedtls_ecp_group *grp,mbedtls_ecp_point *P,int format,size_t *olen,uchar *buf,
              size_t buflen)

{
  int iVar1;
  size_t buflen_00;
  size_t plen;
  int ret;
  size_t buflen_local;
  uchar *buf_local;
  size_t *olen_local;
  int format_local;
  mbedtls_ecp_point *P_local;
  mbedtls_ecp_group *grp_local;
  
  plen._4_4_ = 0;
  if ((format == 0) || (format == 1)) {
    iVar1 = mbedtls_mpi_cmp_int(&P->Z,0);
    if (iVar1 == 0) {
      if (buflen == 0) {
        grp_local._4_4_ = -0x4f00;
      }
      else {
        *buf = '\0';
        *olen = 1;
        grp_local._4_4_ = 0;
      }
    }
    else {
      buflen_00 = mbedtls_mpi_size(&grp->P);
      if (format == 0) {
        *olen = buflen_00 * 2 + 1;
        if (buflen < *olen) {
          return -0x4f00;
        }
        *buf = '\x04';
        plen._4_4_ = mbedtls_mpi_write_binary(&P->X,buf + 1,buflen_00);
        if (plen._4_4_ == 0) {
          plen._4_4_ = mbedtls_mpi_write_binary(&P->Y,buf + buflen_00 + 1,buflen_00);
        }
      }
      else if (format == 1) {
        *olen = buflen_00 + 1;
        if (buflen < *olen) {
          return -0x4f00;
        }
        iVar1 = mbedtls_mpi_get_bit(&P->Y,0);
        *buf = (char)iVar1 + '\x02';
        plen._4_4_ = mbedtls_mpi_write_binary(&P->X,buf + 1,buflen_00);
      }
      grp_local._4_4_ = plen._4_4_;
    }
  }
  else {
    grp_local._4_4_ = -0x4f80;
  }
  return grp_local._4_4_;
}

Assistant:

int mbedtls_ecp_point_write_binary( const mbedtls_ecp_group *grp, const mbedtls_ecp_point *P,
                            int format, size_t *olen,
                            unsigned char *buf, size_t buflen )
{
    int ret = 0;
    size_t plen;

    if( format != MBEDTLS_ECP_PF_UNCOMPRESSED &&
        format != MBEDTLS_ECP_PF_COMPRESSED )
        return( MBEDTLS_ERR_ECP_BAD_INPUT_DATA );

    /*
     * Common case: P == 0
     */
    if( mbedtls_mpi_cmp_int( &P->Z, 0 ) == 0 )
    {
        if( buflen < 1 )
            return( MBEDTLS_ERR_ECP_BUFFER_TOO_SMALL );

        buf[0] = 0x00;
        *olen = 1;

        return( 0 );
    }

    plen = mbedtls_mpi_size( &grp->P );

    if( format == MBEDTLS_ECP_PF_UNCOMPRESSED )
    {
        *olen = 2 * plen + 1;

        if( buflen < *olen )
            return( MBEDTLS_ERR_ECP_BUFFER_TOO_SMALL );

        buf[0] = 0x04;
        MBEDTLS_MPI_CHK( mbedtls_mpi_write_binary( &P->X, buf + 1, plen ) );
        MBEDTLS_MPI_CHK( mbedtls_mpi_write_binary( &P->Y, buf + 1 + plen, plen ) );
    }
    else if( format == MBEDTLS_ECP_PF_COMPRESSED )
    {
        *olen = plen + 1;

        if( buflen < *olen )
            return( MBEDTLS_ERR_ECP_BUFFER_TOO_SMALL );

        buf[0] = 0x02 + mbedtls_mpi_get_bit( &P->Y, 0 );
        MBEDTLS_MPI_CHK( mbedtls_mpi_write_binary( &P->X, buf + 1, plen ) );
    }

cleanup:
    return( ret );
}